

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall upb::generator::Output::operator()<>(Output *this,string_view format)

{
  char *in_RCX;
  string_view data;
  string_view format_00;
  string local_30;
  
  format_00._M_len = format._M_str;
  format_00._M_str = in_RCX;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_30,(lts_20250127 *)format._M_len,format_00);
  data._M_str = local_30._M_dataplus._M_p;
  data._M_len = local_30._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }